

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

bool __thiscall
cmOutputRequiredFilesCommand::InitialPass
          (cmOutputRequiredFilesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type sVar1;
  const_reference pvVar2;
  char *pcVar3;
  cmDependInformation *info_00;
  undefined1 local_318 [8];
  set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
  visited;
  undefined1 local_2e0 [8];
  string err;
  FILE *fout;
  cmDependInformation *info;
  string local_2a8;
  undefined1 local_288 [8];
  cmLBDepend md;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmOutputRequiredFilesCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 != 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_006fface;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::operator=((string *)&this->File,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,1);
  std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)pvVar2);
  cmLBDepend::cmLBDepend((cmLBDepend *)local_288);
  cmLBDepend::SetMakefile((cmLBDepend *)local_288,(this->super_cmCommand).Makefile);
  pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,pcVar3,(allocator *)((long)&info + 7));
  cmLBDepend::AddSearchPath((cmLBDepend *)local_288,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&info + 7));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  info_00 = cmLBDepend::FindDependencies((cmLBDepend *)local_288,pcVar3);
  if (info_00 == (cmDependInformation *)0x0) {
LAB_006ffaa4:
    this_local._7_1_ = 1;
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  }
  else {
    err.field_2._8_8_ = cmsys::SystemTools::Fopen(&this->OutputFile,"w");
    if ((FILE *)err.field_2._8_8_ != (FILE *)0x0) {
      std::
      set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::set((set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
             *)local_318);
      ListDependencies(this,info_00,(FILE *)err.field_2._8_8_,
                       (set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
                        *)local_318);
      fclose((FILE *)err.field_2._8_8_);
      std::
      set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
      ::~set((set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
              *)local_318);
      goto LAB_006ffaa4;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_2e0,"Can not open output file: ",
               (allocator *)((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&visited._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::__cxx11::string::operator+=((string *)local_2e0,(string *)&this->OutputFile);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_2e0);
    this_local._7_1_ = 0;
    visited._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_2e0);
  }
  cmLBDepend::~cmLBDepend((cmLBDepend *)local_288);
LAB_006fface:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOutputRequiredFilesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the arg for final pass
  this->File = args[0];
  this->OutputFile = args[1];

  // compute the list of files
  cmLBDepend md;
  md.SetMakefile(this->Makefile);
  md.AddSearchPath(this->Makefile->GetCurrentSourceDirectory());
  // find the depends for a file
  const cmDependInformation* info = md.FindDependencies(this->File.c_str());
  if (info) {
    // write them out
    FILE* fout = cmsys::SystemTools::Fopen(this->OutputFile, "w");
    if (!fout) {
      std::string err = "Can not open output file: ";
      err += this->OutputFile;
      this->SetError(err);
      return false;
    }
    std::set<cmDependInformation const*> visited;
    this->ListDependencies(info, fout, &visited);
    fclose(fout);
  }

  return true;
}